

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_InsideMap_Test::TestBody
          (MessageDifferencerTest_IgnoreField_InsideMap_Test *this)

{
  uint32_t *puVar1;
  Arena *pAVar2;
  FieldDescriptor *pFVar3;
  undefined1 local_438 [8];
  MessageDifferencer differencer;
  string local_280;
  FieldDescriptor *local_260;
  FieldDescriptor *b;
  string local_250;
  FieldDescriptor *local_230;
  FieldDescriptor *a;
  string local_220;
  FieldDescriptor *local_200;
  FieldDescriptor *item_desc;
  Item *item;
  undefined1 local_1e0 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_IgnoreField_InsideMap_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_1e0);
  item_desc = (FieldDescriptor *)
              proto2_unittest::TestDiffMessage::add_item
                        ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)item_desc,1);
  pFVar3 = item_desc;
  puVar1 = internal::HasBits<1>::operator[]((HasBits<1> *)&item_desc->file_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)pFVar3);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&pFVar3[1].type_descriptor_,"foo",pAVar2);
  proto2_unittest::TestDiffMessage_Item::add_ra((TestDiffMessage_Item *)item_desc,1);
  item_desc = (FieldDescriptor *)
              proto2_unittest::TestDiffMessage::add_item
                        ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)item_desc,2);
  pFVar3 = item_desc;
  puVar1 = internal::HasBits<1>::operator[]((HasBits<1> *)&item_desc->file_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)pFVar3);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&pFVar3[1].type_descriptor_,"bar",pAVar2);
  proto2_unittest::TestDiffMessage_Item::add_ra((TestDiffMessage_Item *)item_desc,2);
  item_desc = (FieldDescriptor *)
              proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_1e0);
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)item_desc,2);
  pFVar3 = item_desc;
  puVar1 = internal::HasBits<1>::operator[]((HasBits<1> *)&item_desc->file_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)pFVar3);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&pFVar3[1].type_descriptor_,"bar",pAVar2);
  proto2_unittest::TestDiffMessage_Item::add_ra((TestDiffMessage_Item *)item_desc,2);
  item_desc = (FieldDescriptor *)
              proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_1e0);
  proto2_unittest::TestDiffMessage_Item::set_a((TestDiffMessage_Item *)item_desc,1);
  pFVar3 = item_desc;
  puVar1 = internal::HasBits<1>::operator[]((HasBits<1> *)&item_desc->file_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pAVar2 = protobuf::MessageLite::GetArena((MessageLite *)pFVar3);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&pFVar3[1].type_descriptor_,"baz",pAVar2);
  proto2_unittest::TestDiffMessage_Item::add_ra((TestDiffMessage_Item *)item_desc,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"item",(allocator<char> *)((long)&a + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  local_200 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"item.a",(allocator<char> *)((long)&b + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  local_230 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"item.b",
             (allocator<char> *)
             ((long)&differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                     super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             + 7));
  pFVar3 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                     super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             + 7));
  local_260 = pFVar3;
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_438);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_438,local_260);
  util::MessageDifferencer::TreatAsMap((MessageDifferencer *)local_438,local_200,local_230);
  ExpectEqualsWithDifferencer
            ((MessageDifferencer *)local_438,(Message *)((long)&msg2.field_0 + 0xa0),
             (Message *)local_1e0);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_438);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_1e0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_InsideMap) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestDiffMessage::Item* item;

  item = msg1.add_item();
  item->set_a(1);
  item->set_b("foo");
  item->add_ra(1);

  item = msg1.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(2);
  item->set_b("bar");
  item->add_ra(2);

  item = msg2.add_item();
  item->set_a(1);
  item->set_b("baz");
  item->add_ra(1);

  const FieldDescriptor* item_desc = GetFieldDescriptor(msg1, "item");
  const FieldDescriptor* a = GetFieldDescriptor(msg1, "item.a");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "item.b");

  util::MessageDifferencer differencer;
  differencer.IgnoreField(b);
  differencer.TreatAsMap(item_desc, a);

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}